

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ghosts.c
# Opt level: O0

void pnga_access_ghost_ptr(Integer g_a,Integer *dims,void *ptr,Integer *ld)

{
  short sVar1;
  short sVar2;
  long *in_RCX;
  undefined8 *in_RDX;
  long in_RSI;
  long in_RDI;
  int _ndim_4;
  int _i_4;
  int _itmp_1;
  int _offset_1;
  int _ndim_3;
  int _i_3;
  int _index_3 [7];
  int _ndim_2;
  int _i_2;
  int _itmp;
  int _ndim_1;
  int _i_1;
  int _index_2 [7];
  int _ndim;
  int _i;
  Integer _dimpos_1;
  Integer _dimstart_1;
  Integer _dim_1;
  Integer _index_1;
  Integer _d_2;
  Integer _nb_1;
  Integer _loc_1;
  Integer _dimpos;
  Integer _dimstart;
  Integer _dim;
  Integer _index;
  Integer _d_1;
  Integer _nb;
  Integer _loc;
  Integer _hi [7];
  Integer _lo [7];
  Integer _offset;
  Integer _last;
  Integer _factor;
  Integer _d;
  Integer me;
  Integer ndim;
  Integer hi [7];
  Integer lo [7];
  Integer i;
  Integer handle;
  char *lptr;
  int local_24c;
  int local_248;
  int local_244;
  int local_23c;
  int local_238 [7];
  int local_21c;
  int local_218;
  int local_214;
  int local_210;
  int local_20c;
  int local_208 [10];
  int local_1e0;
  int local_1dc;
  long local_1d8;
  long local_1d0;
  long local_1c8;
  long local_1c0;
  long local_1b8;
  long local_1b0;
  long local_1a8;
  long local_1a0;
  long local_198;
  long local_190;
  long local_188;
  long local_180;
  long local_178;
  long local_170;
  long local_168 [8];
  long local_128 [8];
  long local_e8;
  long local_e0;
  long local_d8;
  long local_d0;
  long local_c8;
  long local_c0;
  long local_b8 [8];
  long local_78 [8];
  long local_38;
  long local_30;
  char *local_28;
  long *local_20;
  undefined8 *local_18;
  long local_10;
  
  local_30 = in_RDI + 1000;
  local_c0 = (long)GA[local_30].ndim;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_c8 = pnga_nodeid();
  pnga_distribution(_index,_dim,(Integer *)_dimstart,(Integer *)_dimpos);
  for (local_38 = 0; local_38 < local_c0; local_38 = local_38 + 1) {
    *(undefined8 *)(local_10 + local_38 * 8) = 0;
  }
  local_d8 = 1;
  local_e0 = (long)(GA[local_30].ndim + -1);
  local_e8 = 0;
  if (GA[local_30].distr_type == 0) {
    if (GA[local_30].num_rstrctd == 0) {
      local_190 = (long)GA[local_30].ndim;
      local_198 = 0;
      local_178 = 1;
      for (local_180 = 0; local_180 < local_190; local_180 = local_180 + 1) {
        local_178 = GA[local_30].nblock[local_180] * local_178;
      }
      if ((local_178 + -1 < local_c8) || (local_c8 < 0)) {
        for (local_180 = 0; local_180 < local_190; local_180 = local_180 + 1) {
          local_128[local_180] = 0;
          local_168[local_180] = -1;
        }
      }
      else {
        local_188 = local_c8;
        for (local_180 = 0; local_180 < local_190; local_180 = local_180 + 1) {
          local_170 = local_188 % (long)GA[local_30].nblock[local_180];
          local_188 = local_188 / (long)GA[local_30].nblock[local_180];
          local_1a0 = local_170 + local_198;
          local_198 = GA[local_30].nblock[local_180] + local_198;
          local_128[local_180] = GA[local_30].mapc[local_1a0];
          if (local_170 == GA[local_30].nblock[local_180] + -1) {
            local_168[local_180] = GA[local_30].dims[local_180];
          }
          else {
            local_168[local_180] = GA[local_30].mapc[local_1a0 + 1] + -1;
          }
        }
      }
    }
    else if (local_c8 < GA[local_30].num_rstrctd) {
      local_1c8 = (long)GA[local_30].ndim;
      local_1d0 = 0;
      local_1b0 = 1;
      for (local_1b8 = 0; local_1b8 < local_1c8; local_1b8 = local_1b8 + 1) {
        local_1b0 = GA[local_30].nblock[local_1b8] * local_1b0;
      }
      if ((local_1b0 + -1 < local_c8) || (local_c8 < 0)) {
        for (local_1b8 = 0; local_1b8 < local_1c8; local_1b8 = local_1b8 + 1) {
          local_128[local_1b8] = 0;
          local_168[local_1b8] = -1;
        }
      }
      else {
        local_1c0 = local_c8;
        for (local_1b8 = 0; local_1b8 < local_1c8; local_1b8 = local_1b8 + 1) {
          local_1a8 = local_1c0 % (long)GA[local_30].nblock[local_1b8];
          local_1c0 = local_1c0 / (long)GA[local_30].nblock[local_1b8];
          local_1d8 = local_1a8 + local_1d0;
          local_1d0 = GA[local_30].nblock[local_1b8] + local_1d0;
          local_128[local_1b8] = GA[local_30].mapc[local_1d8];
          if (local_1a8 == GA[local_30].nblock[local_1b8] + -1) {
            local_168[local_1b8] = GA[local_30].dims[local_1b8];
          }
          else {
            local_168[local_1b8] = GA[local_30].mapc[local_1d8 + 1] + -1;
          }
        }
      }
    }
    else {
      sVar1 = GA[local_30].ndim;
      local_1e0 = (int)sVar1;
      for (local_1dc = 0; local_1dc < sVar1; local_1dc = local_1dc + 1) {
        local_128[local_1dc] = 0;
        local_168[local_1dc] = -1;
      }
    }
  }
  else {
    local_248 = (int)local_c8;
    if (((GA[local_30].distr_type == 1) || (GA[local_30].distr_type == 2)) ||
       (GA[local_30].distr_type == 3)) {
      sVar1 = GA[local_30].ndim;
      local_210 = (int)sVar1;
      sVar2 = GA[local_30].ndim;
      local_21c = (int)sVar2;
      local_214 = local_248;
      local_208[0] = (int)((long)local_248 % GA[local_30].num_blocks[0]);
      for (local_218 = 1; local_218 < sVar2; local_218 = local_218 + 1) {
        local_214 = (int)((long)(local_214 - local_208[local_218 + -1]) /
                         GA[local_30].num_blocks[local_218 + -1]);
        local_208[local_218] = (int)((long)local_214 % GA[local_30].num_blocks[local_218]);
      }
      for (local_20c = 0; local_20c < sVar1; local_20c = local_20c + 1) {
        local_128[local_20c] = (long)local_208[local_20c] * GA[local_30].block_dims[local_20c] + 1;
        local_168[local_20c] = (long)(local_208[local_20c] + 1) * GA[local_30].block_dims[local_20c]
        ;
        if (GA[local_30].dims[local_20c] < local_168[local_20c]) {
          local_168[local_20c] = GA[local_30].dims[local_20c];
        }
      }
    }
    else if (GA[local_30].distr_type == 4) {
      sVar1 = GA[local_30].ndim;
      local_244 = 0;
      sVar2 = GA[local_30].ndim;
      local_238[0] = (int)((long)local_248 % GA[local_30].num_blocks[0]);
      for (local_24c = 1; local_24c < sVar2; local_24c = local_24c + 1) {
        local_248 = (int)((long)(local_248 - local_238[local_24c + -1]) /
                         GA[local_30].num_blocks[local_24c + -1]);
        local_238[local_24c] = (int)((long)local_248 % GA[local_30].num_blocks[local_24c]);
      }
      for (local_23c = 0; local_23c < sVar1; local_23c = local_23c + 1) {
        local_128[local_23c] = GA[local_30].mapc[local_244 + local_238[local_23c]];
        if ((long)local_238[local_23c] < GA[local_30].num_blocks[local_23c] + -1) {
          local_168[local_23c] = GA[local_30].mapc[local_244 + local_238[local_23c] + 1] + -1;
        }
        else {
          local_168[local_23c] = GA[local_30].dims[local_23c];
        }
        local_244 = local_244 + (int)GA[local_30].num_blocks[local_23c];
      }
    }
  }
  if (local_e0 == 0) {
    *local_20 = (local_168[0] - local_128[0]) + 1 + GA[local_30].width[0] * 2;
  }
  for (local_d0 = 0; local_d0 < local_e0; local_d0 = local_d0 + 1) {
    local_e8 = *(long *)(local_10 + local_d0 * 8) * local_d8 + local_e8;
    local_20[local_d0] =
         (local_168[local_d0] - local_128[local_d0]) + 1 + GA[local_30].width[local_d0] * 2;
    local_d8 = local_20[local_d0] * local_d8;
  }
  local_e8 = *(long *)(local_10 + local_e0 * 8) * local_d8 + local_e8;
  local_28 = GA[local_30].ptr[local_c8] + local_e8 * GA[local_30].elemsize;
  *local_18 = GA[local_30].ptr[local_c8] + local_e8 * GA[local_30].elemsize;
  for (local_38 = 0; local_38 < local_c0; local_38 = local_38 + 1) {
    *(long *)(local_10 + local_38 * 8) =
         (local_b8[local_38] - local_78[local_38]) + 1 + GA[local_30].width[local_38] * 2;
  }
  return;
}

Assistant:

void pnga_access_ghost_ptr(Integer g_a, Integer dims[],
                      void* ptr, Integer ld[])

{
char *lptr;
Integer  handle = GA_OFFSET + g_a;
Integer  i, lo[MAXDIM], hi[MAXDIM];
Integer ndim = GA[handle].ndim;
Integer me = pnga_nodeid();


   pnga_distribution(g_a, me, lo, hi);

   for (i=0; i < ndim; i++) {
     dims[i] = 0;
   }

   gam_LocationWithGhosts(me, handle, dims, &lptr, ld);
   *(char**)ptr = lptr; 
   for (i=0; i < ndim; i++)
     dims[i] = hi[i] - lo[i] + 1 + 2*(Integer)GA[handle].width[i];
}